

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_get_attribute_by_index
          (exr_const_context_t ctxt,int part_index,exr_attr_list_access_mode_t mode,int32_t idx,
          exr_attribute_t **outattr)

{
  long lVar1;
  exr_result_t eVar2;
  long lVar3;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar2 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       *(code **)(ctxt + 0x48));
    return eVar2;
  }
  if (outattr != (exr_attribute_t **)0x0) {
    if ((idx < 0) ||
       (lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8),
       *(int *)(lVar1 + 8) <= idx)) {
      eVar2 = (**(code **)(ctxt + 0x38))(ctxt,4);
      return eVar2;
    }
    if (mode == EXR_ATTR_LIST_SORTED_ORDER) {
      lVar3 = 0x18;
    }
    else {
      if (mode != EXR_ATTR_LIST_FILE_ORDER) goto LAB_00116376;
      lVar3 = 0x10;
    }
    *outattr = *(exr_attribute_t **)(*(long *)(lVar1 + lVar3) + (ulong)(uint)idx * 8);
    return 0;
  }
LAB_00116376:
  eVar2 = (**(code **)(ctxt + 0x38))(ctxt,3);
  return eVar2;
}

Assistant:

exr_result_t
exr_get_attribute_by_index (
    exr_const_context_t         ctxt,
    int                         part_index,
    exr_attr_list_access_mode_t mode,
    int32_t                     idx,
    const exr_attribute_t**     outattr)
{
    exr_attribute_t** srclist;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!outattr)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (idx < 0 || idx >= part->attributes.num_attributes)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ARGUMENT_OUT_OF_RANGE));

    if (mode == EXR_ATTR_LIST_SORTED_ORDER)
        srclist = part->attributes.sorted_entries;
    else if (mode == EXR_ATTR_LIST_FILE_ORDER)
        srclist = part->attributes.entries;
    else
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    *outattr = srclist[idx];
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}